

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<char>::TPZVec(TPZVec<char> *this,initializer_list<char> *list)

{
  size_type sVar1;
  void *pvVar2;
  const_iterator pcVar3;
  char *pcVar4;
  initializer_list<char> *in_RSI;
  undefined8 *in_RDI;
  char *aux;
  const_iterator it_end;
  const_iterator it;
  size_type size;
  initializer_list<char> *in_stack_ffffffffffffffd0;
  const_iterator local_20;
  
  *in_RDI = &PTR__TPZVec_023d3388;
  in_RDI[1] = 0;
  sVar1 = std::initializer_list<char>::size(in_RSI);
  if (sVar1 != 0) {
    pvVar2 = operator_new__(sVar1);
    in_RDI[1] = pvVar2;
  }
  local_20 = std::initializer_list<char>::begin(in_RSI);
  pcVar3 = std::initializer_list<char>::end(in_stack_ffffffffffffffd0);
  pcVar4 = (char *)in_RDI[1];
  for (; local_20 != pcVar3; local_20 = local_20 + 1) {
    *pcVar4 = *local_20;
    pcVar4 = pcVar4 + 1;
  }
  in_RDI[2] = sVar1;
  in_RDI[3] = sVar1;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}